

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

string * __thiscall
MADPComponentDiscreteStates::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteStates *this)

{
  ostream *poVar1;
  E *this_00;
  stringstream ss2;
  ostream local_318 [376];
  stringstream ss;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (this->_m_initialized != false) {
    poVar1 = std::operator<<(local_190,"- nr. states=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    SoftPrintStates_abi_cxx11_((string *)&ss2,this);
    std::operator<<(local_190,(string *)&ss2);
    std::__cxx11::string::~string((string *)&ss2);
    std::operator<<(local_190,"Initial state distr.: ");
    SoftPrintInitialStateDistribution_abi_cxx11_((string *)&ss2,this);
    std::operator<<(local_190,(string *)&ss2);
    std::__cxx11::string::~string((string *)&ss2);
    std::endl<char,std::char_traits<char>>(local_190);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss2);
  poVar1 = std::operator<<(local_318,"MADPComponentDiscreteStates::SoftPrint(");
  poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss2);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

string MADPComponentDiscreteStates::SoftPrint() const
{
    stringstream ss;
    if(!_m_initialized)
    {
        stringstream ss2;
        ss2 << "MADPComponentDiscreteStates::SoftPrint("<< 
        ") - Error: not initialized. " <<endl;
        throw E(ss2);
    }
    ss << "- nr. states="<< GetNrStates()<<endl;
    ss << SoftPrintStates();
    ss << "Initial state distr.: ";
    ss << SoftPrintInitialStateDistribution();
    ss << endl;
    return(ss.str());
}